

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall
pstore::storage::storage<pstore::file::in_memory>
          (storage *this,shared_ptr<pstore::file::in_memory> *file,
          unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
          *page_size,
          unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
          *region_factory)

{
  pointer pfVar1;
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>
  *region_factory_local;
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  *page_size_local;
  shared_ptr<pstore::file::in_memory> *file_local;
  storage *this_local;
  
  std::make_unique<std::array<pstore::sat_entry,65536ul>>();
  std::static_pointer_cast<pstore::file::file_base,pstore::file::in_memory>
            ((shared_ptr<pstore::file::in_memory> *)&this->file_);
  std::
  unique_ptr<pstore::system_page_size_interface,_std::default_delete<pstore::system_page_size_interface>_>
  ::unique_ptr(&this->page_size_,page_size);
  std::unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>::
  unique_ptr(&this->region_factory_,region_factory);
  pfVar1 = std::unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_>::
           operator->(&this->region_factory_);
  (*pfVar1->_vptr_factory[2])(&this->regions_);
  return;
}

Assistant:

storage (std::shared_ptr<File> const & file,
                 std::unique_ptr<system_page_size_interface> && page_size,
                 std::unique_ptr<region::factory> && region_factory)
                : file_{std::static_pointer_cast<file::file_base> (file)}
                , page_size_{std::move (page_size)}
                , region_factory_{std::move (region_factory)}
                , regions_{region_factory_->init ()} {}